

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Promise<void> * __thiscall
kj::_::NullableValue<kj::Promise<void>>::emplace<kj::Promise<void>>
          (NullableValue<kj::Promise<void>> *this,Promise<void> *params)

{
  Promise<void> *params_00;
  Promise<void> *params_local;
  NullableValue<kj::Promise<void>_> *this_local;
  
  if (((byte)*this & 1) != 0) {
    *this = (NullableValue<kj::Promise<void>>)0x0;
    dtor<kj::Promise<void>>((Promise<void> *)(this + 8));
  }
  params_00 = fwd<kj::Promise<void>>(params);
  ctor<kj::Promise<void>,kj::Promise<void>>((Promise<void> *)(this + 8),params_00);
  *this = (NullableValue<kj::Promise<void>>)0x1;
  return (Promise<void> *)(this + 8);
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }